

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O2

void __thiscall verilogAST::SingleLineComment::~SingleLineComment(SingleLineComment *this)

{
  *(undefined ***)this = &PTR_toString_abi_cxx11__001859a8;
  *(undefined **)&this->super_BehavioralStatement = &DAT_001859d0;
  std::unique_ptr<verilogAST::Statement,_std::default_delete<verilogAST::Statement>_>::~unique_ptr
            (&this->statement);
  std::__cxx11::string::~string((string *)&this->value);
  return;
}

Assistant:

~SingleLineComment(){}